

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledFont8x16.cxx
# Opt level: O1

OledPoint SSD1306::drawChar8x16(OledPoint *p,uint8_t c,PixelStyle style,OledPixel *oled)

{
  byte bVar1;
  PixelStyle PVar2;
  OledPoint OVar3;
  PixelStyle style_00;
  int16_t i;
  int iVar4;
  uint uVar5;
  undefined7 in_register_00000031;
  OledPoint p_00;
  int16_t j;
  long lVar6;
  bool bVar7;
  
  PVar2 = oppositeStyle(style);
  lVar6 = 0;
  do {
    bVar1 = font8x16[lVar6 + (ulong)(uint)((int)CONCAT71(in_register_00000031,c) << 4)];
    if (bVar1 != 0) {
      iVar4 = 0;
      uVar5 = 7;
      do {
        style_00 = style;
        if ((bVar1 >> (uVar5 & 0x1f) & 1) == 0) {
          style_00 = PVar2;
        }
        p_00.m_y = p->m_y + (int)lVar6;
        p_00.m_x = p->m_x + iVar4;
        OledPixel::pixel(oled,p_00,style_00);
        iVar4 = iVar4 + 1;
        bVar7 = uVar5 != 0;
        uVar5 = uVar5 - 1;
      } while (bVar7);
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x10);
  OVar3.m_x = p->m_x + 8;
  OVar3.m_y = p->m_y;
  return OVar3;
}

Assistant:

SSD1306::OledPoint
SSD1306::drawChar8x16(
    const OledPoint& p,
    uint8_t c,
    PixelStyle style,
    OledPixel& oled)
{
    PixelStyle opposite = oppositeStyle(style);

    for (int16_t j = 0 ; j < sc_fontHeight8x16 ; ++j)
    {
        uint8_t byte = font8x16[c][j];

        if (byte != 0)
        {
            for (int16_t i = 0 ; i < sc_fontWidth8x16 ; ++i)
            {
                if ((byte >> (sc_fontWidth8x16 - i - 1)) & 1 )
                {
                    oled.pixel(OledPoint(p.x() + i, p.y() + j), style);
                }
                else
                {
                    oled.pixel(OledPoint(p.x() + i, p.y() + j), opposite);
                }
            }
        }
    }

    return OledPoint(p.x() + sc_fontWidth8x16, p.y());
}